

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakSet.cpp
# Opt level: O2

void __thiscall
Js::JavascriptWeakSet::ExtractSnapObjectDataInto
          (JavascriptWeakSet *this,SnapObject *objData,SlabAllocator *alloc)

{
  int iVar1;
  Type pRVar2;
  code *pcVar3;
  int i;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  SnapSetInfo *addtlInfo;
  void **ppvVar7;
  undefined4 *puVar8;
  ulong uVar9;
  ulong count;
  int last;
  
  addtlInfo = (SnapSetInfo *)TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  (**(this->keySet).
     super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
     .super_IWeakReferenceDictionary._vptr_IWeakReferenceDictionary)();
  uVar5 = (this->keySet).
          super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          .count - (this->keySet).
                   super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                   .freeCount;
  addtlInfo->SetSize = 0;
  count = (ulong)(uVar5 + 1);
  ppvVar7 = TTD::SlabAllocatorBase<0>::SlabReserveArraySpace<void*>(alloc,count);
  addtlInfo->SetValueArray = ppvVar7;
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  uVar9 = 0;
  do {
    if ((this->keySet).
        super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
        .bucketCount <= uVar9) {
      if ((ulong)addtlInfo->SetSize == 0) {
        addtlInfo->SetValueArray = (TTDVar *)0x0;
        TTD::SlabAllocatorBase<0>::SlabAbortArraySpace<void*>(alloc,count);
      }
      else {
        TTD::SlabAllocatorBase<0>::SlabCommitArraySpace<void*>
                  (alloc,(ulong)addtlInfo->SetSize,count);
      }
      TTD::NSSnapObjects::
      SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapSetInfo*,(TTD::NSSnapObjects::SnapObjectType)25>
                (objData,addtlInfo);
      return;
    }
    iVar1 = (this->keySet).
            super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            .buckets.ptr[uVar9];
    if (iVar1 != -1) {
      last = -1;
      while (i = iVar1, i != -1) {
        pRVar2 = (this->keySet).
                 super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                 .weakRefs.ptr[i].ptr;
        if (pRVar2 == (Type)0x0) {
          iVar1 = (this->keySet).
                  super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  .entries.ptr[i].super_ValueEntryData<bool>.next;
          JsUtil::
          SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          ::RemoveAt(&(this->keySet).
                      super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                     ,i,last,(uint)uVar9);
        }
        else {
          uVar6 = addtlInfo->SetSize;
          if (uVar5 <= uVar6) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakSet.cpp"
                                        ,0xf8,"(ssi->SetSize < setCountEst)","We are writing junk");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar8 = 0;
            uVar6 = addtlInfo->SetSize;
          }
          addtlInfo->SetValueArray[uVar6] = pRVar2;
          addtlInfo->SetSize = uVar6 + 1;
          iVar1 = (this->keySet).
                  super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  .entries.ptr[i].super_ValueEntryData<bool>.next;
          last = i;
        }
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void JavascriptWeakSet::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapSetInfo* ssi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapSetInfo>();
        uint32 setCountEst = this->Size();

        ssi->SetSize = 0;
        ssi->SetValueArray = alloc.SlabReserveArraySpace<TTD::TTDVar>(setCountEst + 1); //always reserve at least 1 element

        this->Map([&](RecyclableObject* key)
        {
            AssertMsg(ssi->SetSize < setCountEst, "We are writing junk");

            ssi->SetValueArray[ssi->SetSize] = key;
            ssi->SetSize++;
        });

        if(ssi->SetSize == 0)
        {
            ssi->SetValueArray = nullptr;
            alloc.SlabAbortArraySpace<TTD::TTDVar>(setCountEst + 1);
        }
        else
        {
            alloc.SlabCommitArraySpace<TTD::TTDVar>(ssi->SetSize, setCountEst + 1);
        }

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapSetInfo*, TTD::NSSnapObjects::SnapObjectType::SnapSetObject>(objData, ssi);
    }